

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_com.c
# Opt level: O2

MPP_RET hal_vp9d_output_probe(void *buf,void *dxva)

{
  ushort uVar1;
  RK_U64 *data;
  long lVar2;
  long lVar3;
  int iVar4;
  vp9_prob (*pavVar5) [3];
  vp9_prob (*pavVar6) [9];
  vp9_prob (*pavVar7) [9];
  vp9_prob (*paavVar8) [10] [9];
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  byte bVar18;
  long local_130;
  vp9_prob *local_128;
  BitputCtx_t bp;
  long local_f0;
  long local_e8;
  vp9_prob partition_probs [16] [3];
  vp9_prob uv_mode_prob [10] [9];
  byte abStack_3e [14];
  
  bVar18 = 0;
  uVar1 = *(ushort *)((long)dxva + 2);
  memset(buf,0,0x980);
  if ((uVar1 & 0x81) == 1) {
    partition_probs._0_8_ = *(undefined8 *)((long)dxva + 0x1d7);
    partition_probs._8_8_ = *(undefined8 *)((long)dxva + 0x1df);
    partition_probs._16_8_ = *(undefined8 *)((long)dxva + 0x1e7);
    partition_probs._24_8_ = *(undefined8 *)((long)dxva + 0x1ef);
    partition_probs._32_8_ = *(undefined8 *)((long)dxva + 0x1f7);
    partition_probs._40_8_ = *(undefined8 *)((long)dxva + 0x1ff);
    pavVar6 = (vp9_prob (*) [9])((long)dxva + 0xf4);
  }
  else {
    partition_probs[10][2] = '\v';
    partition_probs[0xb][0] = '\x18';
    partition_probs[0xb][1] = '\a';
    partition_probs[0xb][2] = '\x05';
    partition_probs[0xc][0] = 0xae;
    partition_probs[0xc][1] = '#';
    partition_probs[0xc][2] = '1';
    partition_probs[0xd][0] = 'D';
    partition_probs[0xd][1] = '\v';
    partition_probs[0xd][2] = '\x1b';
    partition_probs[0xe][0] = '9';
    partition_probs[0xe][1] = '\x0f';
    partition_probs[0xe][2] = '\t';
    partition_probs[0xf][0] = '\f';
    partition_probs[0xf][1] = '\x03';
    partition_probs[0xf][2] = '\x03';
    partition_probs[5][1] = '\x14';
    partition_probs[5][2] = '0';
    partition_probs[6][0] = 'S';
    partition_probs[6][1] = '5';
    partition_probs[6][2] = '\x18';
    partition_probs[7][0] = '4';
    partition_probs[7][1] = '\x12';
    partition_probs[7][2] = '\x12';
    partition_probs[8][0] = 0x96;
    partition_probs[8][1] = '(';
    partition_probs[8][2] = '\'';
    partition_probs[9][0] = 'N';
    partition_probs[9][1] = '\f';
    partition_probs[9][2] = '\x1a';
    partition_probs[10][0] = 'C';
    partition_probs[10][1] = '!';
    partition_probs[0][0] = 0x9e;
    partition_probs[0][1] = 'a';
    partition_probs[0][2] = '^';
    partition_probs[1][0] = ']';
    partition_probs[1][1] = '\x18';
    partition_probs[1][2] = 'c';
    partition_probs[2][0] = 'U';
    partition_probs[2][1] = 'w';
    partition_probs[2][2] = ',';
    partition_probs[3][0] = '>';
    partition_probs[3][1] = ';';
    partition_probs[3][2] = 'C';
    partition_probs[4][0] = 0x95;
    partition_probs[4][1] = '5';
    partition_probs[4][2] = '5';
    partition_probs[5][0] = '^';
    pavVar6 = vp9_kf_uv_mode_prob;
  }
  pavVar7 = uv_mode_prob;
  for (lVar3 = 0x5a; lVar3 != 0; lVar3 = lVar3 + -1) {
    (*pavVar7)[0] = (*pavVar6)[0];
    pavVar6 = (vp9_prob (*) [9])((long)pavVar6 + (ulong)bVar18 * -2 + 1);
    pavVar7 = (vp9_prob (*) [9])((long)pavVar7 + (ulong)bVar18 * -2 + 1);
  }
  data = (RK_U64 *)mpp_osal_calloc("hal_vp9d_output_probe",0x988);
  mpp_set_bitput_ctx(&bp,data,0x130);
  pavVar5 = partition_probs;
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
      mpp_put_bits(&bp,(ulong)(*pavVar5)[lVar14],8);
    }
    pavVar5 = pavVar5 + 1;
  }
  for (lVar3 = -3; lVar3 != 0; lVar3 = lVar3 + 1) {
    mpp_put_bits(&bp,(ulong)*(byte *)((long)dxva + lVar3 + 0x79),8);
  }
  for (lVar3 = -7; lVar3 != 0; lVar3 = lVar3 + 1) {
    mpp_put_bits(&bp,(ulong)*(byte *)((long)dxva + lVar3 + 0x76),8);
  }
  for (lVar3 = -3; lVar3 != 0; lVar3 = lVar3 + 1) {
    mpp_put_bits(&bp,(ulong)*(byte *)((long)dxva + lVar3 + 0x192),8);
  }
  lVar3 = (long)dxva + 0x183;
  for (lVar14 = 0; lVar15 = -3, lVar14 != 2; lVar14 = lVar14 + 1) {
    for (; lVar15 != 0; lVar15 = lVar15 + 1) {
      mpp_put_bits(&bp,(ulong)*(byte *)(lVar3 + 3 + lVar15),8);
    }
    lVar3 = lVar3 + 3;
  }
  lVar3 = (long)dxva + 0x189;
  for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
    for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
      mpp_put_bits(&bp,(ulong)*(byte *)(lVar3 + lVar15),8);
    }
    lVar3 = lVar3 + 2;
  }
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    mpp_put_bits(&bp,(ulong)*(byte *)((long)dxva + lVar3 + 0x18d),8);
  }
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    mpp_put_bits(&bp,(ulong)*(byte *)((long)dxva + lVar3 + 0x16b),8);
  }
  mpp_put_align(&bp,0x80,0);
  if ((uVar1 & 0x81) == 1) {
    lVar3 = (long)dxva + 0xd0;
    for (lVar14 = 0; lVar15 = -9, lVar14 != 4; lVar14 = lVar14 + 1) {
      for (; lVar15 != 0; lVar15 = lVar15 + 1) {
        mpp_put_bits(&bp,(ulong)*(byte *)(lVar3 + 9 + lVar15),8);
      }
      lVar3 = lVar3 + 9;
    }
    for (lVar3 = -5; lVar3 != 0; lVar3 = lVar3 + 1) {
      mpp_put_bits(&bp,(ulong)*(byte *)((long)dxva + lVar3 + 0x174),8);
    }
    for (lVar3 = -5; lVar3 != 0; lVar3 = lVar3 + 1) {
      mpp_put_bits(&bp,(ulong)*(byte *)((long)dxva + lVar3 + 0x183),8);
    }
    lVar3 = (long)dxva + 0x174;
    for (lVar14 = 0; lVar14 != 5; lVar14 = lVar14 + 1) {
      for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
        mpp_put_bits(&bp,(ulong)*(byte *)(lVar3 + lVar15),8);
      }
      lVar3 = lVar3 + 2;
    }
    lVar3 = (long)dxva + 0x156;
    for (lVar14 = 0; lVar15 = -3, lVar14 != 7; lVar14 = lVar14 + 1) {
      for (; lVar15 != 0; lVar15 = lVar15 + 1) {
        mpp_put_bits(&bp,(ulong)*(byte *)(lVar3 + 3 + lVar15),8);
      }
      lVar3 = lVar3 + 3;
    }
    lVar3 = (long)dxva + 0x14e;
    for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
      for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
        mpp_put_bits(&bp,(ulong)*(byte *)(lVar3 + lVar15),8);
      }
      lVar3 = lVar3 + 2;
    }
    mpp_put_align(&bp,0x80,0);
    local_e8 = (long)dxva + 0x207;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      local_f0 = local_e8;
      for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
        iVar4 = 0;
        lVar15 = local_f0;
        for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
          lVar13 = lVar15;
          for (lVar16 = 0; lVar16 != 6; lVar16 = lVar16 + 1) {
            for (lVar10 = -3; lVar10 != 0; lVar10 = lVar10 + 1) {
              mpp_put_bits(&bp,(ulong)*(byte *)(lVar13 + 3 + lVar10),8);
              iVar4 = iVar4 + 1;
              if (iVar4 == 0x1b) {
                iVar4 = 0;
                mpp_put_align(&bp,0x80,0);
              }
            }
            lVar13 = lVar13 + 3;
          }
          lVar15 = lVar15 + 0x12;
        }
        mpp_put_align(&bp,0x80,0);
        local_f0 = local_f0 + 0xd8;
      }
      local_e8 = local_e8 + 0x1b0;
    }
    local_e8 = (long)dxva + 0x273;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      lVar14 = local_e8;
      for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
        iVar4 = 0;
        lVar2 = lVar14;
        for (lVar13 = 0; lVar13 != 6; lVar13 = lVar13 + 1) {
          lVar16 = lVar2;
          for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
            for (lVar11 = -3; lVar11 != 0; lVar11 = lVar11 + 1) {
              mpp_put_bits(&bp,(ulong)*(byte *)(lVar16 + 3 + lVar11),8);
              iVar4 = iVar4 + 1;
              if (iVar4 == 0x1b) {
                iVar4 = 0;
                mpp_put_align(&bp,0x80,0);
              }
            }
            lVar16 = lVar16 + 3;
          }
          lVar2 = lVar2 + 0x12;
        }
        mpp_put_align(&bp,0x80,0);
        lVar14 = lVar14 + 0xd8;
      }
      local_e8 = local_e8 + 0x1b0;
    }
    pavVar6 = uv_mode_prob;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      for (lVar14 = 0; lVar14 != 9; lVar14 = lVar14 + 1) {
        mpp_put_bits(&bp,(ulong)(*pavVar6)[lVar14],8);
      }
      pavVar6 = pavVar6 + 1;
    }
    mpp_put_align(&bp,0x80,0);
    pavVar6 = uv_mode_prob + 3;
    for (lVar3 = 3; lVar14 = -9, lVar3 != 6; lVar3 = lVar3 + 1) {
      for (; lVar14 != 0; lVar14 = lVar14 + 1) {
        mpp_put_bits(&bp,(ulong)pavVar6[1][lVar14],8);
      }
      pavVar6 = pavVar6 + 1;
    }
    mpp_put_align(&bp,0x80,0);
    pavVar6 = uv_mode_prob + 6;
    for (lVar3 = 6; lVar14 = -9, lVar3 != 9; lVar3 = lVar3 + 1) {
      for (; lVar14 != 0; lVar14 = lVar14 + 1) {
        mpp_put_bits(&bp,(ulong)pavVar6[1][lVar14],8);
      }
      pavVar6 = pavVar6 + 1;
    }
    mpp_put_align(&bp,0x80,0);
    for (lVar3 = -9; lVar3 != 0; lVar3 = lVar3 + 1) {
      mpp_put_bits(&bp,(ulong)abStack_3e[lVar3],8);
    }
    mpp_put_align(&bp,0x80,0);
    mpp_put_bits(&bp,0,8);
    mpp_put_align(&bp,0x80,0);
    for (lVar3 = -3; lVar3 != 0; lVar3 = lVar3 + 1) {
      mpp_put_bits(&bp,(ulong)*(byte *)((long)dxva + lVar3 + 0x195),8);
    }
    for (lVar3 = 0; lVar3 != 0x42; lVar3 = lVar3 + 0x21) {
      mpp_put_bits(&bp,(ulong)*(byte *)((long)dxva + lVar3 + 0x195),8);
    }
    lVar3 = (long)dxva + 0x196;
    for (lVar14 = 0; lVar15 = -10, lVar14 != 2; lVar14 = lVar14 + 1) {
      for (; lVar15 != 0; lVar15 = lVar15 + 1) {
        mpp_put_bits(&bp,(ulong)*(byte *)(lVar3 + 10 + lVar15),8);
      }
      lVar3 = lVar3 + 0x21;
    }
    for (lVar3 = 0; lVar3 != 0x42; lVar3 = lVar3 + 0x21) {
      mpp_put_bits(&bp,(ulong)*(byte *)((long)dxva + lVar3 + 0x1a0),8);
    }
    lVar3 = (long)dxva + 0x1a1;
    for (lVar14 = 0; lVar15 = -10, lVar14 != 2; lVar14 = lVar14 + 1) {
      for (; lVar15 != 0; lVar15 = lVar15 + 1) {
        mpp_put_bits(&bp,(ulong)*(byte *)(lVar3 + 10 + lVar15),8);
      }
      lVar3 = lVar3 + 0x21;
    }
    lVar3 = (long)dxva + 0x1ab;
    for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
      lVar15 = lVar3;
      for (lVar2 = 0; lVar13 = -3, lVar2 != 2; lVar2 = lVar2 + 1) {
        for (; lVar13 != 0; lVar13 = lVar13 + 1) {
          mpp_put_bits(&bp,(ulong)*(byte *)(lVar15 + 3 + lVar13),8);
        }
        lVar15 = lVar15 + 3;
      }
      lVar3 = lVar3 + 0x21;
    }
    lVar3 = (long)dxva + 0x1b1;
    for (lVar14 = 0; lVar15 = -3, lVar14 != 2; lVar14 = lVar14 + 1) {
      for (; lVar15 != 0; lVar15 = lVar15 + 1) {
        mpp_put_bits(&bp,(ulong)*(byte *)(lVar3 + 3 + lVar15),8);
      }
      lVar3 = lVar3 + 0x21;
    }
    for (lVar3 = 0; lVar3 != 0x42; lVar3 = lVar3 + 0x21) {
      mpp_put_bits(&bp,(ulong)*(byte *)((long)dxva + lVar3 + 0x1b4),8);
    }
    for (lVar3 = 0; lVar3 != 0x42; lVar3 = lVar3 + 0x21) {
      mpp_put_bits(&bp,(ulong)*(byte *)((long)dxva + lVar3 + 0x1b5),8);
    }
    mpp_put_align(&bp,0x80,0);
  }
  else {
    local_130 = (long)dxva + 0x207;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      lVar14 = local_130;
      for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
        iVar4 = 0;
        lVar2 = lVar14;
        for (lVar13 = 0; lVar13 != 6; lVar13 = lVar13 + 1) {
          lVar16 = lVar2;
          for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
            for (lVar11 = -3; lVar11 != 0; lVar11 = lVar11 + 1) {
              mpp_put_bits(&bp,(ulong)*(byte *)(lVar16 + 3 + lVar11),8);
              iVar4 = iVar4 + 1;
              if (iVar4 == 0x1b) {
                iVar4 = 0;
                mpp_put_align(&bp,0x80,0);
              }
            }
            lVar16 = lVar16 + 3;
          }
          lVar2 = lVar2 + 0x12;
        }
        mpp_put_align(&bp,0x80,0);
        lVar14 = lVar14 + 0xd8;
      }
      local_130 = local_130 + 0x1b0;
    }
    paavVar8 = vp9_kf_y_mode_prob;
    local_128 = vp9_kf_uv_mode_prob[0];
    for (uVar12 = 0; uVar12 != 10; uVar12 = uVar12 + 1) {
      iVar4 = 0;
      lVar3 = 0;
      pavVar6 = *paavVar8;
      for (; lVar3 != 10; lVar3 = lVar3 + 1) {
        for (lVar14 = 0; lVar14 != 9; lVar14 = lVar14 + 1) {
          mpp_put_bits(&bp,(ulong)(*(vp9_prob (*) [9])*pavVar6)[lVar14],8);
          iVar4 = iVar4 + 1;
          if (iVar4 == 0x1b) {
            iVar4 = 0;
            mpp_put_align(&bp,0x80,0);
          }
        }
        pavVar6 = pavVar6 + 1;
      }
      if (uVar12 < 4) {
        iVar4 = 0x17 - ((uint)(uVar12 != 3) * 4 + 0x2a);
        for (uVar9 = 0; (uint)(uVar12 != 3) * 2 + 0x15 != uVar9; uVar9 = uVar9 + 1) {
          mpp_put_bits(&bp,(ulong)local_128[uVar9],8);
          iVar4 = iVar4 + 1;
        }
        while (bVar17 = iVar4 != 0, iVar4 = iVar4 + -1, bVar17) {
          mpp_put_bits(&bp,0,8);
        }
      }
      else {
        iVar4 = 0x17;
        while (bVar17 = iVar4 != 0, iVar4 = iVar4 + -1, bVar17) {
          mpp_put_bits(&bp,0,8);
        }
      }
      mpp_put_align(&bp,0x80,0);
      paavVar8 = (vp9_prob (*) [10] [9])((long)paavVar8 + 0x5a);
      local_128 = local_128 + 0x17;
    }
    iVar4 = 2;
    while (bVar17 = iVar4 != 0, iVar4 = iVar4 + -1, bVar17) {
      mpp_put_bits(&bp,0,8);
      mpp_put_align(&bp,0x80,0);
    }
  }
  memcpy(buf,data,0x980);
  mpp_osal_free("hal_vp9d_output_probe",data);
  return MPP_OK;
}

Assistant:

MPP_RET hal_vp9d_output_probe(void *buf, void *dxva)
{
    RK_S32 i, j, k, m, n;
    RK_S32 fifo_len = 304;
    RK_U64 *probe_packet = NULL;
    BitputCtx_t bp;
    DXVA_PicParams_VP9 *pic_param = (DXVA_PicParams_VP9*)dxva;
    RK_S32 intraFlag = (!pic_param->frame_type || pic_param->intra_only);
    vp9_prob partition_probs[PARTITION_CONTEXTS][PARTITION_TYPES - 1];
    vp9_prob uv_mode_prob[INTRA_MODES][INTRA_MODES - 1];

    memset(buf, 0, 304 * 8);

    if (intraFlag) {
        memcpy(partition_probs, vp9_kf_partition_probs, sizeof(partition_probs));
        memcpy(uv_mode_prob, vp9_kf_uv_mode_prob, sizeof(uv_mode_prob));
    } else {
        memcpy(partition_probs, pic_param->prob.partition, sizeof(partition_probs));
        memcpy(uv_mode_prob, pic_param->prob.uv_mode, sizeof(uv_mode_prob));
    }

    probe_packet = mpp_calloc(RK_U64, fifo_len + 1);
    mpp_set_bitput_ctx(&bp, probe_packet, fifo_len);
    //sb info  5 x 128 bit
    for (i = 0; i < PARTITION_CONTEXTS; i++) //kf_partition_prob
        for (j = 0; j < PARTITION_TYPES - 1; j++)
            mpp_put_bits(&bp, partition_probs[i][j], 8); //48

    for (i = 0; i < PREDICTION_PROBS; i++) //Segment_id_pred_prob //3
        mpp_put_bits(&bp, pic_param->stVP9Segments.pred_probs[i], 8);

    for (i = 0; i < SEG_TREE_PROBS; i++) //Segment_id_probs
        mpp_put_bits(&bp, pic_param->stVP9Segments.tree_probs[i], 8); //7

    for (i = 0; i < SKIP_CONTEXTS; i++) //Skip_flag_probs //3
        mpp_put_bits(&bp, pic_param->prob.skip[i], 8);

    for (i = 0; i < TX_SIZE_CONTEXTS; i++) //Tx_size_probs //6
        for (j = 0; j < TX_SIZES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.tx32p[i][j], 8);

    for (i = 0; i < TX_SIZE_CONTEXTS; i++) //Tx_size_probs //4
        for (j = 0; j < TX_SIZES - 2; j++)
            mpp_put_bits(&bp, pic_param->prob.tx16p[i][j], 8);

    for (i = 0; i < TX_SIZE_CONTEXTS; i++) //Tx_size_probs //2
        mpp_put_bits(&bp, pic_param->prob.tx8p[i], 8);

    for (i = 0; i < INTRA_INTER_CONTEXTS; i++) //Tx_size_probs //4
        mpp_put_bits(&bp, pic_param->prob.intra[i], 8);

    mpp_put_align(&bp, 128, 0);
    if (intraFlag) { //intra probs
        //intra only //149 x 128 bit ,aligned to 152 x 128 bit
        //coeff releated prob   64 x 128 bit
        for (i = 0; i < TX_SIZES; i++)
            for (j = 0; j < PLANE_TYPES; j++) {
                RK_S32 byte_count = 0;
                for (k = 0; k < COEF_BANDS; k++) {
                    for (m = 0; m < COEFF_CONTEXTS; m++)
                        for (n = 0; n < UNCONSTRAINED_NODES; n++) {
                            mpp_put_bits(&bp, pic_param->prob.coef[i][j][0][k][m][n], 8);

                            byte_count++;
                            if (byte_count == 27) {
                                mpp_put_align(&bp, 128, 0);
                                byte_count = 0;
                            }
                        }
                }
                mpp_put_align(&bp, 128, 0);
            }

        //intra mode prob  80 x 128 bit
        for (i = 0; i < INTRA_MODES; i++) { //vp9_kf_y_mode_prob
            RK_S32 byte_count = 0;
            for (j = 0; j < INTRA_MODES; j++)
                for (k = 0; k < INTRA_MODES - 1; k++) {
                    mpp_put_bits(&bp, vp9_kf_y_mode_prob[i][j][k], 8);
                    byte_count++;
                    if (byte_count == 27) {
                        byte_count = 0;
                        mpp_put_align(&bp, 128, 0);
                    }

                }
            if (i < 4) {
                for (m = 0; m < (i < 3 ? 23 : 21); m++)
                    mpp_put_bits(&bp, ((vp9_prob *)(&vp9_kf_uv_mode_prob[0][0]))[i * 23 + m], 8);
                for (; m < 23; m++)
                    mpp_put_bits(&bp, 0, 8);
            } else {
                for (m = 0; m < 23; m++)
                    mpp_put_bits(&bp, 0, 8);
            }
            mpp_put_align(&bp, 128, 0);
        }
        //align to 152 x 128 bit
        for (i = 0; i < INTER_PROB_SIZE_ALIGN_TO_128 - INTRA_PROB_SIZE_ALIGN_TO_128; i++) { //aligned to 153 x 256 bit
            mpp_put_bits(&bp, 0, 8);
            mpp_put_align(&bp, 128, 0);
        }
    } else {
        //inter probs
        //151 x 128 bit ,aligned to 152 x 128 bit
        //inter only

        //intra_y_mode & inter_block info   6 x 128 bit
        for (i = 0; i < BLOCK_SIZE_GROUPS; i++) //intra_y_mode
            for (j = 0; j < INTRA_MODES - 1; j++)
                mpp_put_bits(&bp, pic_param->prob.y_mode[i][j], 8);

        for (i = 0; i < COMP_INTER_CONTEXTS; i++) //reference_mode prob
            mpp_put_bits(&bp, pic_param->prob.comp[i], 8);

        for (i = 0; i < REF_CONTEXTS; i++) //comp ref bit
            mpp_put_bits(&bp, pic_param->prob.comp_ref[i], 8);

        for (i = 0; i < REF_CONTEXTS; i++) //single ref bit
            for (j = 0; j < 2; j++)
                mpp_put_bits(&bp, pic_param->prob.single_ref[i][j], 8);

        for (i = 0; i < INTER_MODE_CONTEXTS; i++) //mv mode bit
            for (j = 0; j < INTER_MODES - 1; j++)
                mpp_put_bits(&bp, pic_param->prob.mv_mode[i][j], 8);


        for (i = 0; i < SWITCHABLE_FILTER_CONTEXTS; i++) //comp ref bit
            for (j = 0; j < SWITCHABLE_FILTERS - 1; j++)
                mpp_put_bits(&bp, pic_param->prob.filter[i][j], 8);

        mpp_put_align(&bp, 128, 0);

        //128 x 128bit
        //coeff releated
        for (i = 0; i < TX_SIZES; i++)
            for (j = 0; j < PLANE_TYPES; j++) {
                RK_S32 byte_count = 0;
                for (k = 0; k < COEF_BANDS; k++) {
                    for (m = 0; m < COEFF_CONTEXTS; m++)
                        for (n = 0; n < UNCONSTRAINED_NODES; n++) {
                            mpp_put_bits(&bp, pic_param->prob.coef[i][j][0][k][m][n], 8);
                            byte_count++;
                            if (byte_count == 27) {
                                mpp_put_align(&bp, 128, 0);
                                byte_count = 0;
                            }
                        }
                }
                mpp_put_align(&bp, 128, 0);
            }
        for (i = 0; i < TX_SIZES; i++)
            for (j = 0; j < PLANE_TYPES; j++) {
                RK_S32 byte_count = 0;
                for (k = 0; k < COEF_BANDS; k++) {
                    for (m = 0; m < COEFF_CONTEXTS; m++) {
                        for (n = 0; n < UNCONSTRAINED_NODES; n++) {
                            mpp_put_bits(&bp, pic_param->prob.coef[i][j][1][k][m][n], 8);
                            byte_count++;
                            if (byte_count == 27) {
                                mpp_put_align(&bp, 128, 0);
                                byte_count = 0;
                            }
                        }

                    }
                }
                mpp_put_align(&bp, 128, 0);
            }

        //intra uv mode 6 x 128
        for (i = 0; i < 3; i++) //intra_uv_mode
            for (j = 0; j < INTRA_MODES - 1; j++)
                mpp_put_bits(&bp, uv_mode_prob[i][j], 8);
        mpp_put_align(&bp, 128, 0);

        for (; i < 6; i++) //intra_uv_mode
            for (j = 0; j < INTRA_MODES - 1; j++)
                mpp_put_bits(&bp, uv_mode_prob[i][j], 8);
        mpp_put_align(&bp, 128, 0);

        for (; i < 9; i++) //intra_uv_mode
            for (j = 0; j < INTRA_MODES - 1; j++)
                mpp_put_bits(&bp, uv_mode_prob[i][j], 8);
        mpp_put_align(&bp, 128, 0);
        for (; i < INTRA_MODES; i++) //intra_uv_mode
            for (j = 0; j < INTRA_MODES - 1; j++)
                mpp_put_bits(&bp, uv_mode_prob[i][j], 8);

        mpp_put_align(&bp, 128, 0);
        mpp_put_bits(&bp, 0, 8);
        mpp_put_align(&bp, 128, 0);

        //mv releated 6 x 128
        for (i = 0; i < MV_JOINTS - 1; i++) //mv_joint_type
            mpp_put_bits(&bp, pic_param->prob.mv_joint[i], 8);

        for (i = 0; i < 2; i++) { //sign bit
            mpp_put_bits(&bp, pic_param->prob.mv_comp[i].sign, 8);
        }
        for (i = 0; i < 2; i++) { //classes bit
            for (j = 0; j < MV_CLASSES - 1; j++)
                mpp_put_bits(&bp, pic_param->prob.mv_comp[i].classes[j], 8);
        }
        for (i = 0; i < 2; i++) { //classe0 bit
            mpp_put_bits(&bp, pic_param->prob.mv_comp[i].class0, 8);
        }
        for (i = 0; i < 2; i++) { // bits
            for (j = 0; j < MV_OFFSET_BITS; j++)
                mpp_put_bits(&bp, pic_param->prob.mv_comp[i].bits[j], 8);
        }
        for (i = 0; i < 2; i++) { //class0_fp bit
            for (j = 0; j < CLASS0_SIZE; j++)
                for (k = 0; k < MV_FP_SIZE - 1; k++)
                    mpp_put_bits(&bp, pic_param->prob.mv_comp[i].class0_fp[j][k], 8);
        }
        for (i = 0; i < 2; i++) { //comp ref bit
            for (j = 0; j < MV_FP_SIZE - 1; j++)
                mpp_put_bits(&bp, pic_param->prob.mv_comp[i].fp[j], 8);
        }
        for (i = 0; i < 2; i++) { //class0_hp bit

            mpp_put_bits(&bp, pic_param->prob.mv_comp[i].class0_hp, 8);
        }
        for (i = 0; i < 2; i++) { //hp bit
            mpp_put_bits(&bp, pic_param->prob.mv_comp[i].hp, 8);
        }
        mpp_put_align(&bp, 128, 0);
    }

    memcpy(buf, probe_packet, 304 * 8);

#ifdef dump
    if (intraFlag) {
        fwrite(probe_packet, 1, 302 * 8, vp9_fp);
    } else {
        fwrite(probe_packet, 1, 304 * 8, vp9_fp);
    }
    fflush(vp9_fp);
#endif
    MPP_FREE(probe_packet);

    return 0;
}